

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int enc_uint64(archive_write *a,uint64_t val)

{
  ssize_t sVar1;
  int local_2c;
  byte local_25;
  int i;
  uint8_t numdata [9];
  uint mask;
  uint64_t val_local;
  archive_write *a_local;
  
  numdata[1] = 0x80;
  numdata[2] = '\0';
  numdata[3] = '\0';
  numdata[4] = '\0';
  local_25 = 0;
  local_2c = 1;
  unique0x10000052 = val;
  do {
    if (8 < local_2c) {
LAB_006734ef:
      sVar1 = compress_out(a,&local_25,(long)local_2c,ARCHIVE_Z_RUN);
      return (int)sVar1;
    }
    if (stack0xffffffffffffffe8 < (uint)numdata._1_4_) {
      local_25 = local_25 | (byte)stack0xffffffffffffffe8;
      goto LAB_006734ef;
    }
    (&local_25)[local_2c] = (byte)stack0xffffffffffffffe8;
    register0x00000000 = stack0xffffffffffffffe8 >> 8;
    local_25 = local_25 | (byte)numdata._1_4_;
    numdata._1_4_ = (uint)numdata._1_4_ >> 1;
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static int
enc_uint64(struct archive_write *a, uint64_t val)
{
	unsigned mask = 0x80;
	uint8_t numdata[9];
	int i;

	numdata[0] = 0;
	for (i = 1; i < (int)sizeof(numdata); i++) {
		if (val < mask) {
			numdata[0] |= (uint8_t)val;
			break;
		}
		numdata[i] = (uint8_t)val;
		val >>= 8;
		numdata[0] |= mask;
		mask >>= 1;
	}
	return ((int)compress_out(a, numdata, i, ARCHIVE_Z_RUN));
}